

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O1

void __thiscall sf::Shape::draw(Shape *this,RenderTarget *target,RenderStates states)

{
  bool bVar1;
  Transform *right;
  
  right = Transformable::getTransform(&this->super_Transformable);
  operator*=(&states.transform,right);
  states.texture = this->m_texture;
  bVar1 = VertexBuffer::isAvailable();
  if (bVar1) {
    RenderTarget::draw(target,&this->m_verticesBuffer,&states);
  }
  else {
    RenderTarget::draw(target,&(this->m_vertices).super_Drawable,&states);
  }
  if ((this->m_outlineThickness != 0.0) || (NAN(this->m_outlineThickness))) {
    states.texture = (Texture *)0x0;
    bVar1 = VertexBuffer::isAvailable();
    if (bVar1) {
      RenderTarget::draw(target,&this->m_outlineVerticesBuffer,&states);
    }
    else {
      RenderTarget::draw(target,&(this->m_outlineVertices).super_Drawable,&states);
    }
  }
  return;
}

Assistant:

void Shape::draw(RenderTarget& target, RenderStates states) const
{
    states.transform *= getTransform();

    // Render the inside
    states.texture = m_texture;

    if (VertexBuffer::isAvailable())
    {
        target.draw(m_verticesBuffer, states);
    }
    else
    {
        target.draw(m_vertices, states);
    }

    // Render the outline
    if (m_outlineThickness != 0)
    {
        states.texture = NULL;

        if (VertexBuffer::isAvailable())
        {
            target.draw(m_outlineVerticesBuffer, states);
        }
        else
        {
            target.draw(m_outlineVertices, states);
        }
    }
}